

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

FlattenLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_flatten(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x12d) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x12d;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.flatten_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FlattenLayerParams>
                   (arena);
    (this->layer_).flatten_ = (FlattenLayerParams *)LVar2;
  }
  return (FlattenLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::FlattenLayerParams* NeuralNetworkLayer::_internal_mutable_flatten() {
  if (!_internal_has_flatten()) {
    clear_layer();
    set_has_flatten();
    layer_.flatten_ = CreateMaybeMessage< ::CoreML::Specification::FlattenLayerParams >(GetArenaForAllocation());
  }
  return layer_.flatten_;
}